

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# student.h
# Opt level: O2

int __thiscall
CP::priority_queue<int,_std::less<int>_>::find_level
          (priority_queue<int,_std::less<int>_> *this,int k)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  double dVar6;
  
  iVar3 = (int)this->mSize;
  iVar2 = -1;
  iVar1 = iVar3 + -1;
  do {
    iVar4 = iVar1;
    if (iVar4 < 0) goto LAB_00101425;
    uVar5 = iVar3 + iVar2;
    iVar2 = iVar2 + -1;
    iVar1 = iVar4 + -1;
  } while (this->mData[uVar5 & 0x7fffffff] != k);
  if (iVar4 + -1 == -1) {
    iVar2 = 0;
  }
  else {
LAB_00101425:
    dVar6 = log2((double)iVar4);
    iVar2 = (int)dVar6;
  }
  return iVar2;
}

Assistant:

int CP::priority_queue<T, C>::find_level(T k) const {
    int i = mSize - 1;
    for (; i >= 0; --i) {
        if (mData[i] == k) {
            break;
        }
    }
    return i == 0 ? i : log2(i);
}